

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  pointer *pppFVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  pointer ppFVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  ulong uVar11;
  pointer ppFVar12;
  pointer ppFVar13;
  pointer ppFVar14;
  long lVar15;
  iterator iVar16;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  FieldDescriptor *pFVar17;
  pointer ppFVar18;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i_1;
  long lVar19;
  long lVar20;
  uint local_74;
  FieldDescriptor *local_58 [2];
  uint32_t *local_48;
  ReflectionSchema *local_40;
  uint32_t *local_38;
  
  ppFVar14 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar14) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar14;
  }
  if ((this->schema_).default_instance_ == message) {
    return;
  }
  if ((this->schema_).has_bits_offset_ == -1) {
    local_48 = (uint32_t *)0x0;
  }
  else {
    local_48 = GetHasBits(this,message);
  }
  local_40 = &this->schema_;
  local_38 = (this->schema_).has_bit_indices_;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve(output,(long)this->descriptor_->field_count_);
  uVar3 = this->last_non_weak_field_index_;
  if ((int)uVar3 < 0) {
    ppFVar14 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_74 = 0;
LAB_0029a3af:
    ppFVar18 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    lVar15 = 0;
    lVar19 = 0x28;
    local_74 = 0;
    do {
      if (this->descriptor_->field_count_ <= lVar15) {
        ListFields();
LAB_0029a52f:
        ListFields();
        goto LAB_0029a544;
      }
      pFVar5 = this->descriptor_->fields_;
      bVar2 = *(byte *)((long)pFVar5 + lVar19 + -0x27);
      if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) goto LAB_0029a52f;
      pFVar17 = (FieldDescriptor *)((long)pFVar5 + lVar19 + -0x28);
      if ((bVar2 & 0x20) == 0) {
        if ((bVar2 & 0x10) == 0) {
          lVar20 = 0;
        }
        else {
          lVar20 = *(long *)(&pFVar5->super_SymbolBase + lVar19);
          if (lVar20 == 0) goto LAB_0029a54e;
        }
        bVar7 = internal::ReflectionSchema::InRealOneof(local_40,pFVar17);
        if (bVar7) {
          uVar9 = *(uint *)((long)pFVar5 + lVar19 + -0x24);
          if ((ulong)*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                              (long)((int)((ulong)(lVar20 - *(long *)(*(long *)(lVar20 + 0x10) +
                                                                     0x48)) >> 3) * -0x49249249) * 4
                              + (ulong)(uint)(this->schema_).oneof_case_offset_) == (long)(int)uVar9
             ) {
            if (uVar9 < local_74) {
              uVar9 = 0xffffffff;
            }
            iVar16._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_74 = uVar9;
            if (iVar16._M_current !=
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0029a2bb;
LAB_0029a23f:
            local_58[0] = pFVar17;
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)output,iVar16,local_58);
          }
        }
        else {
          if ((local_48 == (uint32_t *)0x0) || (local_38[lVar15] == 0xffffffff)) {
            bVar7 = HasFieldSingular(this,message,pFVar17);
          }
          else {
            bVar7 = IsFieldPresentGivenHasbits(this,message,pFVar17,local_48,local_38[lVar15]);
          }
          if (bVar7 != false) {
            uVar9 = *(uint *)((long)pFVar5 + lVar19 + -0x24);
            if (uVar9 < local_74) {
              uVar9 = 0xffffffff;
            }
            iVar16._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_74 = uVar9;
            if (iVar16._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0029a23f;
LAB_0029a2bb:
            *iVar16._M_current = pFVar17;
            pppFVar1 = &(output->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
            local_58[0] = pFVar17;
          }
        }
      }
      else {
        iVar8 = FieldSize(this,message,pFVar17);
        if (0 < iVar8) {
          uVar9 = *(uint *)((long)pFVar5 + lVar19 + -0x24);
          if (uVar9 < local_74) {
            uVar9 = 0xffffffff;
          }
          iVar16._M_current =
               (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_74 = uVar9;
          if (iVar16._M_current ==
              (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58[0] = pFVar17;
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)output,iVar16,local_58);
          }
          else {
            *iVar16._M_current = pFVar17;
            pppFVar1 = &(output->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
            local_58[0] = pFVar17;
          }
        }
      }
      lVar15 = lVar15 + 1;
      lVar19 = lVar19 + 0x58;
    } while ((ulong)uVar3 + 1 != lVar15);
    ppFVar18 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar14 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (local_74 == 0xffffffff) {
      if (ppFVar18 != ppFVar14) {
        uVar11 = (long)ppFVar14 - (long)ppFVar18 >> 3;
        lVar15 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar18,ppFVar14,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppFVar14 - (long)ppFVar18 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar18,ppFVar14);
        }
        else {
          ppFVar13 = ppFVar18 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar18,ppFVar13);
          for (; ppFVar13 != ppFVar14; ppFVar13 = ppFVar13 + 1) {
            pFVar5 = ppFVar13[-1];
            pFVar17 = *ppFVar13;
            iVar8 = pFVar17->number_;
            iVar4 = pFVar5->number_;
            ppFVar18 = ppFVar13;
            while (iVar8 < iVar4) {
              *ppFVar18 = pFVar5;
              pFVar5 = ppFVar18[-2];
              ppFVar18 = ppFVar18 + -1;
              iVar4 = pFVar5->number_;
            }
            *ppFVar18 = pFVar17;
          }
        }
      }
      ppFVar14 = (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      local_74 = ppFVar14[-1]->number_;
      goto LAB_0029a3af;
    }
  }
  if ((this->schema_).extensions_offset_ != -1) {
    lVar15 = (long)ppFVar14 - (long)ppFVar18;
    uVar10 = internal::ReflectionSchema::GetExtensionSetOffset(local_40);
    internal::ExtensionSet::AppendToList
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10),
               this->descriptor_,this->descriptor_pool_,output);
    ppFVar18 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar14 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    ppFVar12 = (pointer)((long)ppFVar18 + lVar15);
    ppFVar13 = ppFVar12;
    if (ppFVar12 != ppFVar14) {
      ppFVar6 = (pointer)((long)ppFVar18 + lVar15 + 8);
      do {
        ppFVar13 = ppFVar6;
        if (ppFVar13 == ppFVar14) goto LAB_0029a42b;
        ppFVar6 = ppFVar13 + 1;
      } while (ppFVar13[-1]->number_ <= (*ppFVar13)->number_);
    }
    if (ppFVar13 != ppFVar14) {
LAB_0029a544:
      ListFields();
LAB_0029a54e:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
LAB_0029a42b:
    if (((long)ppFVar14 - (long)ppFVar18 != lVar15) &&
       (bVar7 = (uint)(*ppFVar12)->number_ < local_74, local_74 = (*ppFVar12)->number_, bVar7))
    goto LAB_0029a490;
  }
  if (local_74 != 0xffffffff) {
    ppFVar13 = ppFVar18;
    if (ppFVar18 == ppFVar14) {
      return;
    }
    do {
      ppFVar18 = ppFVar13 + 1;
      if (ppFVar18 == ppFVar14) {
        return;
      }
      pFVar5 = *ppFVar13;
      ppFVar13 = ppFVar18;
    } while (pFVar5->number_ <= (*ppFVar18)->number_);
    if (ppFVar18 == ppFVar14) {
      return;
    }
    ListFields();
  }
LAB_0029a490:
  if (ppFVar18 != ppFVar14) {
    uVar11 = (long)ppFVar14 - (long)ppFVar18 >> 3;
    lVar15 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
              (ppFVar18,ppFVar14,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppFVar14 - (long)ppFVar18 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar18,ppFVar14);
    }
    else {
      ppFVar13 = ppFVar18 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar18,ppFVar13);
      for (; ppFVar13 != ppFVar14; ppFVar13 = ppFVar13 + 1) {
        pFVar5 = ppFVar13[-1];
        pFVar17 = *ppFVar13;
        iVar8 = pFVar17->number_;
        iVar4 = pFVar5->number_;
        ppFVar18 = ppFVar13;
        while (iVar8 < iVar4) {
          *ppFVar18 = pFVar5;
          pFVar5 = ppFVar18[-2];
          ppFVar18 = ppFVar18 + -1;
          iVar4 = pFVar5->number_;
        }
        *ppFVar18 = pFVar17;
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  // Fields in messages are usually added with the increasing tags.
  uint32_t last = 0;  // UINT32_MAX if out-of-order
  auto append_to_output = [&last, &output](const FieldDescriptor* field) {
    CheckInOrder(field, &last);
    output->push_back(field);
  };
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        append_to_output(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          append_to_output(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        // Equivalent to: HasFieldSingular(message, field)
        if (IsFieldPresentGivenHasbits(message, field, has_bits,
                                       has_bits_indices[i])) {
          append_to_output(field);
        }
      } else if (HasFieldSingular(message, field)) {
        // Fall back on proto3-style HasBit.
        append_to_output(field);
      }
    }
  }
  // Descriptors of ExtensionSet are appended in their increasing tag
  // order and they are usually bigger than the field tags so if all fields are
  // not sorted, let them be sorted.
  if (last == UINT32_MAX) {
    std::sort(output->begin(), output->end(), FieldNumberSorter());
    last = output->back()->number();
  }
  size_t last_size = output->size();
  if (schema_.HasExtensionSet()) {
    // Descriptors of ExtensionSet are appended in their increasing order.
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
    ABSL_DCHECK(std::is_sorted(output->begin() + last_size, output->end(),
                               FieldNumberSorter()));
    if (output->size() != last_size) {
      CheckInOrder((*output)[last_size], &last);
    }
  }
  if (last != UINT32_MAX) {
    ABSL_DCHECK(
        std::is_sorted(output->begin(), output->end(), FieldNumberSorter()));
  } else {
    // ListFields() must sort output by field number.
    std::sort(output->begin(), output->end(), FieldNumberSorter());
  }
}